

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseCDSect(xmlParserCtxtPtr ctxt)

{
  int max;
  int iVar1;
  xmlChar *pxVar2;
  bool bVar3;
  int newSize;
  xmlChar *tmp;
  int local_38;
  int maxLength;
  int l;
  int cur;
  int sl;
  int s;
  int rl;
  int r;
  int size;
  int len;
  xmlChar *buf;
  xmlParserCtxtPtr ctxt_local;
  
  _size = (xmlChar *)0x0;
  r = 0;
  rl = 100;
  max = 10000000;
  if ((ctxt->options & 0x80000U) != 0) {
    max = 1000000000;
  }
  if (*ctxt->input->cur != '<') {
    return;
  }
  if (ctxt->input->cur[1] != '!') {
    return;
  }
  if (ctxt->input->cur[2] != '[') {
    return;
  }
  ctxt->input->cur = ctxt->input->cur + 3;
  ctxt->input->col = ctxt->input->col + 3;
  buf = (xmlChar *)ctxt;
  if (*ctxt->input->cur == '\0') {
    xmlParserGrow(ctxt);
  }
  if (**(char **)(*(long *)(buf + 0x38) + 0x20) != 'C') {
    return;
  }
  if (*(char *)(*(long *)(*(long *)(buf + 0x38) + 0x20) + 1) != 'D') {
    return;
  }
  if (*(char *)(*(long *)(*(long *)(buf + 0x38) + 0x20) + 2) != 'A') {
    return;
  }
  if (*(char *)(*(long *)(*(long *)(buf + 0x38) + 0x20) + 3) != 'T') {
    return;
  }
  if (*(char *)(*(long *)(*(long *)(buf + 0x38) + 0x20) + 4) != 'A') {
    return;
  }
  if (*(char *)(*(long *)(*(long *)(buf + 0x38) + 0x20) + 5) != '[') {
    return;
  }
  *(long *)(*(long *)(buf + 0x38) + 0x20) = *(long *)(*(long *)(buf + 0x38) + 0x20) + 6;
  *(int *)(*(long *)(buf + 0x38) + 0x38) = *(int *)(*(long *)(buf + 0x38) + 0x38) + 6;
  if (**(char **)(*(long *)(buf + 0x38) + 0x20) == '\0') {
    xmlParserGrow((xmlParserCtxtPtr)buf);
  }
  s = xmlCurrentCharRecover((xmlParserCtxtPtr)buf,&sl);
  if (s < 0x100) {
    if (((8 < s) && (s < 0xb)) || ((s == 0xd || (0x1f < s)))) {
LAB_001466c3:
      if (**(char **)(*(long *)(buf + 0x38) + 0x20) == '\n') {
        *(int *)(*(long *)(buf + 0x38) + 0x34) = *(int *)(*(long *)(buf + 0x38) + 0x34) + 1;
        *(undefined4 *)(*(long *)(buf + 0x38) + 0x38) = 1;
      }
      else {
        *(int *)(*(long *)(buf + 0x38) + 0x38) = *(int *)(*(long *)(buf + 0x38) + 0x38) + 1;
      }
      *(long *)(*(long *)(buf + 0x38) + 0x20) = *(long *)(*(long *)(buf + 0x38) + 0x20) + (long)sl;
      cur = xmlCurrentCharRecover((xmlParserCtxtPtr)buf,&l);
      if (cur < 0x100) {
        if (((8 < cur) && (cur < 0xb)) || ((cur == 0xd || (0x1f < cur)))) {
LAB_001467b0:
          if (**(char **)(*(long *)(buf + 0x38) + 0x20) == '\n') {
            *(int *)(*(long *)(buf + 0x38) + 0x34) = *(int *)(*(long *)(buf + 0x38) + 0x34) + 1;
            *(undefined4 *)(*(long *)(buf + 0x38) + 0x38) = 1;
          }
          else {
            *(int *)(*(long *)(buf + 0x38) + 0x38) = *(int *)(*(long *)(buf + 0x38) + 0x38) + 1;
          }
          *(long *)(*(long *)(buf + 0x38) + 0x20) =
               *(long *)(*(long *)(buf + 0x38) + 0x20) + (long)l;
          maxLength = xmlCurrentCharRecover((xmlParserCtxtPtr)buf,&local_38);
          _size = (xmlChar *)(*xmlMalloc)((long)rl);
          if (_size != (xmlChar *)0x0) {
            do {
              if (maxLength < 0x100) {
                if (((8 < maxLength) && (maxLength < 0xb)) ||
                   ((maxLength == 0xd || (bVar3 = false, 0x1f < maxLength)))) {
LAB_001468be:
                  bVar3 = true;
                  if ((s == 0x5d) && (bVar3 = true, cur == 0x5d)) {
                    bVar3 = maxLength != 0x3e;
                  }
                }
              }
              else if ((((0xff < maxLength) && (maxLength < 0xd800)) ||
                       ((0xdfff < maxLength && (maxLength < 0xfffe)))) ||
                      ((bVar3 = false, 0xffff < maxLength && (bVar3 = false, maxLength < 0x110000)))
                      ) goto LAB_001468be;
              if (!bVar3) {
                _size[r] = '\0';
                if (maxLength == 0x3e) {
                  if (**(char **)(*(long *)(buf + 0x38) + 0x20) == '\n') {
                    *(int *)(*(long *)(buf + 0x38) + 0x34) =
                         *(int *)(*(long *)(buf + 0x38) + 0x34) + 1;
                    *(undefined4 *)(*(long *)(buf + 0x38) + 0x38) = 1;
                  }
                  else {
                    *(int *)(*(long *)(buf + 0x38) + 0x38) =
                         *(int *)(*(long *)(buf + 0x38) + 0x38) + 1;
                  }
                  *(long *)(*(long *)(buf + 0x38) + 0x20) =
                       *(long *)(*(long *)(buf + 0x38) + 0x20) + (long)local_38;
                  if ((*(long *)buf != 0) && (*(int *)(buf + 0x14c) == 0)) {
                    if ((*(uint *)(buf + 0x234) & 0x4000) == 0) {
                      if (*(long *)(*(long *)buf + 200) != 0) {
                        (**(code **)(*(long *)buf + 200))(*(undefined8 *)(buf + 8),_size,r);
                      }
                    }
                    else if (*(long *)(*(long *)buf + 0x88) != 0) {
                      (**(code **)(*(long *)buf + 0x88))(*(undefined8 *)(buf + 8),_size,r);
                    }
                  }
                }
                else {
                  xmlFatalErrMsgStr((xmlParserCtxtPtr)buf,XML_ERR_CDATA_NOT_FINISHED,
                                    "CData section not finished\n%.50s\n",_size);
                }
                goto LAB_00146b62;
              }
              iVar1 = rl;
              pxVar2 = _size;
              if (rl <= r + 5) {
                iVar1 = xmlGrowCapacity(rl,1,1,max);
                if (iVar1 < 0) {
                  xmlFatalErrMsg((xmlParserCtxtPtr)buf,XML_ERR_CDATA_NOT_FINISHED,
                                 "CData section too big found\n");
                  goto LAB_00146b62;
                }
                pxVar2 = (xmlChar *)(*xmlRealloc)(_size,(long)iVar1);
                if (pxVar2 == (xmlChar *)0x0) goto code_r0x00146952;
              }
              _size = pxVar2;
              rl = iVar1;
              if (s < 0x80) {
                _size[r] = (xmlChar)s;
                r = r + 1;
              }
              else {
                iVar1 = xmlCopyCharMultiByte(_size + r,s);
                r = iVar1 + r;
              }
              s = cur;
              sl = l;
              cur = maxLength;
              l = local_38;
              if (**(char **)(*(long *)(buf + 0x38) + 0x20) == '\n') {
                *(int *)(*(long *)(buf + 0x38) + 0x34) = *(int *)(*(long *)(buf + 0x38) + 0x34) + 1;
                *(undefined4 *)(*(long *)(buf + 0x38) + 0x38) = 1;
              }
              else {
                *(int *)(*(long *)(buf + 0x38) + 0x38) = *(int *)(*(long *)(buf + 0x38) + 0x38) + 1;
              }
              *(long *)(*(long *)(buf + 0x38) + 0x20) =
                   *(long *)(*(long *)(buf + 0x38) + 0x20) + (long)local_38;
              maxLength = xmlCurrentCharRecover((xmlParserCtxtPtr)buf,&local_38);
            } while( true );
          }
          xmlErrMemory((xmlParserCtxtPtr)buf);
          goto LAB_00146b62;
        }
      }
      else if ((((0xff < cur) && (cur < 0xd800)) || ((0xdfff < cur && (cur < 0xfffe)))) ||
              ((0xffff < cur && (cur < 0x110000)))) goto LAB_001467b0;
      xmlFatalErr((xmlParserCtxtPtr)buf,XML_ERR_CDATA_NOT_FINISHED,(char *)0x0);
      goto LAB_00146b62;
    }
  }
  else if ((((0xff < s) && (s < 0xd800)) || ((0xdfff < s && (s < 0xfffe)))) ||
          ((0xffff < s && (s < 0x110000)))) goto LAB_001466c3;
  xmlFatalErr((xmlParserCtxtPtr)buf,XML_ERR_CDATA_NOT_FINISHED,(char *)0x0);
LAB_00146b62:
  (*xmlFree)(_size);
  return;
code_r0x00146952:
  xmlErrMemory((xmlParserCtxtPtr)buf);
  goto LAB_00146b62;
}

Assistant:

void
xmlParseCDSect(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = XML_PARSER_BUFFER_SIZE;
    int r, rl;
    int	s, sl;
    int cur, l;
    int maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                    XML_MAX_HUGE_LENGTH :
                    XML_MAX_TEXT_LENGTH;

    if ((CUR != '<') || (NXT(1) != '!') || (NXT(2) != '['))
        return;
    SKIP(3);

    if (!CMP6(CUR_PTR, 'C', 'D', 'A', 'T', 'A', '['))
        return;
    SKIP(6);

    r = xmlCurrentCharRecover(ctxt, &rl);
    if (!IS_CHAR(r)) {
	xmlFatalErr(ctxt, XML_ERR_CDATA_NOT_FINISHED, NULL);
        goto out;
    }
    NEXTL(rl);
    s = xmlCurrentCharRecover(ctxt, &sl);
    if (!IS_CHAR(s)) {
	xmlFatalErr(ctxt, XML_ERR_CDATA_NOT_FINISHED, NULL);
        goto out;
    }
    NEXTL(sl);
    cur = xmlCurrentCharRecover(ctxt, &l);
    buf = xmlMalloc(size);
    if (buf == NULL) {
	xmlErrMemory(ctxt);
        goto out;
    }
    while (IS_CHAR(cur) &&
           ((r != ']') || (s != ']') || (cur != '>'))) {
	if (len + 5 >= size) {
	    xmlChar *tmp;
            int newSize;

            newSize = xmlGrowCapacity(size, 1, 1, maxLength);
            if (newSize < 0) {
                xmlFatalErrMsg(ctxt, XML_ERR_CDATA_NOT_FINISHED,
                               "CData section too big found\n");
                goto out;
            }
	    tmp = xmlRealloc(buf, newSize);
	    if (tmp == NULL) {
		xmlErrMemory(ctxt);
                goto out;
	    }
	    buf = tmp;
	    size = newSize;
	}
	COPY_BUF(buf, len, r);
	r = s;
	rl = sl;
	s = cur;
	sl = l;
	NEXTL(l);
	cur = xmlCurrentCharRecover(ctxt, &l);
    }
    buf[len] = 0;
    if (cur != '>') {
	xmlFatalErrMsgStr(ctxt, XML_ERR_CDATA_NOT_FINISHED,
	                     "CData section not finished\n%.50s\n", buf);
        goto out;
    }
    NEXTL(l);

    /*
     * OK the buffer is to be consumed as cdata.
     */
    if ((ctxt->sax != NULL) && (!ctxt->disableSAX)) {
        if (ctxt->options & XML_PARSE_NOCDATA) {
            if (ctxt->sax->characters != NULL)
                ctxt->sax->characters(ctxt->userData, buf, len);
        } else {
            if (ctxt->sax->cdataBlock != NULL)
                ctxt->sax->cdataBlock(ctxt->userData, buf, len);
        }
    }

out:
    xmlFree(buf);
}